

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_void>
     ::load(iarchive *ar,
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           *data,uint protocol_version)

{
  bool bVar1;
  error *peVar2;
  reference this;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  size_t i;
  unsigned_long local_28;
  size_t count;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *paStack_18;
  uint protocol_version_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *data_local;
  iarchive *ar_local;
  
  count._4_4_ = protocol_version;
  paStack_18 = data;
  data_local = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                *)ar;
  bintoken::iarchive::load<trial::protocol::bintoken::token::begin_array>(ar);
  bintoken::iarchive::load_override<unsigned_long>
            ((iarchive *)data_local,&local_28,(ulong)count._4_4_);
  if (local_28 != 2) {
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(peVar2,incompatible_type);
    __cxa_throw(peVar2,&bintoken::error::typeinfo,bintoken::error::~error);
  }
  for (value.field_2._8_8_ = 0; (ulong)value.field_2._8_8_ < 2;
      value.field_2._8_8_ = value.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)local_60);
    boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
              ((interface_iarchive<trial::protocol::bintoken::iarchive> *)data_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    this = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
           ::operator[](paStack_18,value.field_2._8_8_);
    std::__cxx11::string::operator=((string *)this,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
  }
  bVar1 = bintoken::iarchive::at<trial::protocol::bintoken::token::end_array>
                    ((iarchive *)data_local);
  if (!bVar1) {
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(peVar2,expected_end_array);
    __cxa_throw(peVar2,&bintoken::error::typeinfo,bintoken::error::~error);
  }
  bintoken::iarchive::load<trial::protocol::bintoken::token::end_array>((iarchive *)data_local);
  return;
}

Assistant:

static void load(protocol::bintoken::iarchive& ar,
                     std::array<T, N>& data,
                     const unsigned int protocol_version)
    {
        ar.load<bintoken::token::begin_array>();

        std::size_t count;
        ar.load_override(count, protocol_version);
        if (count != N)
            throw bintoken::error(bintoken::incompatible_type);

        for (std::size_t i = 0; i < N; ++i)
        {
            T value;
            ar >> value;
            data[i] = value;
        }
        if (!ar.at<bintoken::token::end_array>())
            throw bintoken::error(bintoken::expected_end_array);
        ar.load<bintoken::token::end_array>();
    }